

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cradix.c
# Opt level: O1

void CRadix(LPPSTR a,UINT n)

{
  Stack *pSVar1;
  int *piVar2;
  uint uVar3;
  int d;
  uchar *puVar4;
  LPPSTR ta;
  LPBYTE __ptr;
  ulong *count_00;
  LPPSTR ppuVar5;
  UINT i;
  ulong uVar6;
  long lVar7;
  byte *pbVar8;
  ulong uVar9;
  void *__src;
  uchar **a_00;
  byte bVar10;
  ulong uVar11;
  UINT d_00;
  ulong uVar12;
  ulong uVar13;
  byte *__src_00;
  long lVar14;
  bool bVar15;
  bool bVar16;
  UINT count [256];
  LPPSTR GrpKP [256];
  LPSTR GrpKB [256];
  UINT local_1838;
  ulong local_1830 [255];
  LPPSTR local_1038;
  long alStack_1030 [255];
  byte *local_838 [257];
  
  ta = (LPPSTR)malloc(n * 8);
  __ptr = (LPBYTE)malloc(n * 4);
  sp->sa = a;
  sp->sk = __ptr;
  sp->sn = (int)n;
  pSVar1 = sp + 1;
  piVar2 = &sp->sb;
  sp = pSVar1;
  *piVar2 = 0;
  memset(&local_1838,0,0x7f8);
  if (stack < pSVar1) {
    sp = pSVar1;
    do {
      count_00 = &local_1838;
      pSVar1 = sp + -1;
      a_00 = sp[-1].sa;
      __src_00 = sp[-1].sk;
      uVar3 = sp[-1].sn;
      uVar13 = (ulong)(int)uVar3;
      d = sp[-1].sb;
      d_00 = (UINT)d;
      sp = pSVar1;
      if (__src_00 == (byte *)0x0) {
LAB_00250b1c:
        RDFK(&local_1038,a_00,uVar13,ta,count_00,d_00);
      }
      else {
        uVar12 = d_00 & 3;
        if (uVar12 == 0) {
          if (uVar3 < 0x81) goto LAB_00250b1c;
          uVar6 = 0;
          pbVar8 = __src_00;
          do {
            puVar4 = a_00[uVar6];
            (&local_1838)[puVar4[d_00]] = (&local_1838)[puVar4[d_00]] + 1;
            bVar10 = puVar4[d_00];
            if (bVar10 == 0) {
              bVar15 = true;
              lVar14 = 4;
            }
            else {
              uVar9 = 0;
              do {
                pbVar8[uVar9] = bVar10;
                uVar11 = uVar9 + 1;
                bVar10 = puVar4[uVar9 + d_00 + 1];
                bVar15 = uVar9 < 3;
                if (bVar10 == 0) break;
                bVar16 = uVar9 < 3;
                uVar9 = uVar11;
              } while (bVar16);
              lVar14 = 4 - uVar11;
              pbVar8 = pbVar8 + uVar11;
            }
            if (bVar15) {
              *pbVar8 = 0;
              pbVar8 = pbVar8 + lVar14;
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 != uVar13);
        }
        else if (uVar3 != 0) {
          uVar6 = uVar13;
          pbVar8 = __src_00;
          do {
            (&local_1838)[*pbVar8] = (&local_1838)[*pbVar8] + 1;
            pbVar8 = pbVar8 + (4 - uVar12);
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
        }
        do {
          uVar6 = *count_00;
          count_00 = count_00 + 1;
        } while (uVar6 == 0);
        uVar9 = 0;
        if (uVar6 < uVar13) {
          uVar9 = uVar13;
        }
        uVar11 = uVar12 ^ 3;
        local_1038 = a_00;
        local_838[0] = __src_00;
        lVar14 = 0;
        ppuVar5 = a_00;
        pbVar8 = __src_00;
        do {
          ppuVar5 = ppuVar5 + (&local_1838)[lVar14];
          alStack_1030[lVar14] = (long)ppuVar5;
          pbVar8 = pbVar8 + (&local_1838)[lVar14] * uVar11;
          local_838[lVar14 + 1] = pbVar8;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 0xff);
        lVar14 = 4 - uVar12;
        memcpy(ta,a_00,uVar9 * 8);
        if (uVar6 < uVar13) {
          lVar7 = 0;
          pbVar8 = __src_00;
          do {
            *(uchar **)alStack_1030[(ulong)*pbVar8 - 1] = ta[lVar7];
            alStack_1030[(ulong)*pbVar8 - 1] = alStack_1030[(ulong)*pbVar8 - 1] + 8;
            lVar7 = lVar7 + 1;
            pbVar8 = pbVar8 + lVar14;
          } while (uVar9 + (uVar9 == 0) != lVar7);
        }
        memcpy(ta,__src_00,lVar14 * uVar13);
        if (uVar3 != 0) {
          __src = (void *)((long)ta + 1);
          do {
            bVar10 = *(byte *)((long)__src + -1);
            pbVar8 = local_838[bVar10];
            if ((int)uVar12 != 3) {
              memcpy(pbVar8,__src,uVar11 + (uVar11 == 0));
            }
            local_838[bVar10] = pbVar8 + uVar11;
            __src = (void *)((long)__src + lVar14);
            uVar13 = uVar13 - 1;
          } while (uVar13 != 0);
        }
        lVar14 = 0;
        do {
          if ((lVar14 == 0) || (uVar13 = (&local_1838)[lVar14], uVar13 < 0x15)) {
            if (1 < (&local_1838)[lVar14] && lVar14 != 0) {
              isort(a_00,(int)(&local_1838)[lVar14],d);
            }
          }
          else {
            sp->sa = a_00;
            sp->sk = __src_00;
            sp->sn = (int)uVar13;
            piVar2 = &sp->sb;
            sp = sp + 1;
            *piVar2 = d + 1;
          }
          a_00 = a_00 + (&local_1838)[lVar14];
          __src_00 = __src_00 + (&local_1838)[lVar14] * uVar11;
          (&local_1838)[lVar14] = 0;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 0xff);
      }
    } while (stack < sp);
  }
  free(ta);
  free(__ptr);
  return;
}

Assistant:

void CRadix(LPPSTR a, UINT n)
{
	UINT kbsd, kbsd1, i, j, stage, d, MEMSIZE;
	UINT *cptr, gs, count[AS];
	LPSTR tj, tk, ax, tl, kb, ss, tt, GrpKB[AS];
	LPPSTR GrpKP[AS], ak, ta, tc, t;
	if (sizeof(LPPSTR)>sizeof(unsigned char)*BS)
		MEMSIZE=sizeof(LPPSTR);
	else
		MEMSIZE=sizeof(unsigned char)*BS;
	/* workspace */
	ta = (LPPSTR)malloc(n * MEMSIZE);
	/* memory for key buffers */
	tk = (LPBYTE)malloc(n * sizeof(unsigned char) * BS);
	tj=tk;
	push(a, tk, n, 0); for (i=AL; i<AH; i++) count[i]=0;
	while (!stackempty()) {
		pop(a, tk, n, stage);
		if (tk) {
			/* set the counters and
			   fill the key buffers if necessary */
			if ((d=stage%BS)!=0)
				for (i=0, tl=tk; i<n; i++, tl+=(BS-d))
					count[*tl]++;
			else {
				if (n>KBC)
					FillKeyBuffer(a, tk, count, n, stage);
				else {
					RDFK(GrpKP, a, n, ta, count, stage);
					continue;
				}
			}
			/* check if there is only 1 group */
			cptr=&count[AL];
			while (*cptr<1) cptr++;
			if (*cptr<n) gs=n; else gs=0;
			/* calculate both key ptr and
			   key buffer addresses */
			kbsd=BS-d, kbsd1=kbsd-1;
			GrpKP[AL]=a; GrpKB[AL]=tk;
			for (ak=a, ax=tk, i=AL; i<AH; i++) {
				GrpKP[i+1]=ak+=count[i];
				GrpKB[i+1]=ax+=count[i]*kbsd1;
			}

			/* permute the key ptrs */
			memcpy(ta, a, sizeof(LPSTR)*gs);
			for (i=0, ax=tk, tc=ta; i<gs;
					i++, ax+=kbsd, tc++) {
				*GrpKP[*ax]=*tc; GrpKP[*ax]++;
			}
			/* permute the key buffers */
			memcpy(ta, tk, sizeof(unsigned char)*n*kbsd);
			for (i=0, kb=(LPBYTE)ta; i<n; i++, *t+=kbsd1) {
				t=&GrpKB[*kb]; ss=*t; tt=kb+1;
				for (j=0; j<kbsd1; j++)
				{ *ss=*tt; ss++; tt++; }
				kb+=kbsd;
			}
			/* down 1 level */
			for (ak=a, ax=tk, i=AL; i<AH; i++) {
				if (splittable(i))
				{ push(ak, ax, count[i], stage+1); }
				else if (count[i]>1 && i>0)
					isort(ak, count[i], stage);
				ak+=count[i]; ax+=count[i]*(kbsd1);
				count[i]=0;
			}
		}
		else RDFK(GrpKP, a, n, ta, count, stage);
	}
	free((void*)ta);
	free((void*)tj);
}